

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readODlist(ecx_contextt *context,uint16 Slave,ec_ODlistt *pODlist)

{
  bool bVar1;
  uint8 uVar2;
  bool bVar3;
  ushort local_846;
  ushort local_844;
  ushort uStack_842;
  boolean First;
  uint8 cnt;
  boolean stop;
  uint16 offset;
  uint16 sp;
  uint16 i;
  uint16 n;
  uint16 x;
  int wkc;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  ec_SDOservicet *aSDOp;
  ec_SDOservicet *SDOp;
  ec_ODlistt *pODlist_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  pODlist->Slave = Slave;
  pODlist->Entries = 0;
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)&n);
  n = 8;
  x = 0;
  wkc._0_1_ = 0;
  uVar2 = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
  context->slavelist[Slave].mbx_cnt = uVar2;
  wkc._1_1_ = uVar2 * '\x10' + '\x03';
  wkc._2_2_ = 0x8000;
  MbxOut[0] = '\x01';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut[4] = '\x01';
  MbxOut[5] = '\0';
  _sp = ecx_mbxsend(context,Slave,(ec_mbxbuft *)&n,20000);
  if (0 < _sp) {
    offset = 0;
    local_844 = 0;
    bVar1 = true;
    local_846 = 1;
    do {
      bVar3 = true;
      ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
      _sp = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)(MbxOut + 0x3f8),700000);
      if (0 < _sp) {
        if (((MbxOut[0x3fd] & 0xf) == 3) && ((MbxIn[0] & 0x7f) == 2)) {
          if (bVar1) {
            _cnt = (ushort)((int)((ushort)MbxOut._1016_2_ - 8) / 2);
          }
          else {
            _cnt = (ushort)((int)((ushort)MbxOut._1016_2_ - 6) / 2);
          }
          if (0x400 < (uint)local_844 + (uint)_cnt) {
            _cnt = 0x401 - local_844;
            ecx_SDOinfoerror(context,Slave,0,'\0',0xf000000);
          }
          if (0x400 < (uint)pODlist->Entries + (uint)_cnt) {
            _cnt = 0x400 - pODlist->Entries;
          }
          pODlist->Entries = pODlist->Entries + _cnt;
          for (uStack_842 = 0; uStack_842 < _cnt; uStack_842 = uStack_842 + 1) {
            pODlist->Index[(int)((uint)local_844 + (uint)uStack_842)] =
                 *(uint16 *)(MbxIn + (long)(int)((uint)uStack_842 + (uint)local_846) * 2 + 4);
          }
          local_844 = local_844 + _cnt;
          bVar3 = MbxIn._2_2_ == 0;
          bVar1 = false;
          local_846 = 0;
        }
        else {
          if ((MbxIn[0] & 0x7f) == 7) {
            ecx_SDOinfoerror(context,Slave,0,'\0',MbxIn._4_4_);
          }
          else {
            ecx_packeterror(context,Slave,0,'\0',1);
          }
          bVar3 = true;
          _sp = 0;
          offset = offset + 0x14;
        }
      }
      offset = offset + 1;
    } while (offset < 0x81 && !bVar3);
  }
  return _sp;
}

Assistant:

int ecx_readODlist(ecx_contextt *context, uint16 Slave, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   ec_mbxbuft MbxIn, MbxOut;
   int wkc;
   uint16 x, n, i, sp, offset;
   boolean stop;
   uint8 cnt;
   boolean First;

   pODlist->Slave = Slave;
   pODlist->Entries = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_ODLIST_REQ; /* get object description list request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(0x01); /* all objects */
   /* send get object description list request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      x = 0; 
      sp = 0;
      First = TRUE;
      offset = 1; /* offset to skip info header in first frame, otherwise set to 0 */
      do
      {
         stop = TRUE; /* assume this is last iteration */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
         /* got response ? */
         if (wkc > 0)
         {
            /* response should be CoE and "get object description list response" */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                ((aSDOp->Opcode & 0x7f) == ECT_GET_ODLIST_RES))
            {
               if (First)
               {   
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - (6 + 2)) / 2;
               }
               else
               {
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - 6) / 2;
               }
               /* check if indexes fit in buffer structure */
               if ((sp + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST + 1 - sp;
                  ecx_SDOinfoerror(context, Slave, 0, 0, 0xf000000); /* Too many entries for master buffer */
                  stop = TRUE;
               }
               /* trim to maximum number of ODlist entries defined */
               if ((pODlist->Entries + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST - pODlist->Entries;
               }
               pODlist->Entries += n;
               /* extract indexes one by one */
               for (i = 0; i < n; i++)
               {
                  pODlist->Index[sp + i] = etohs(aSDOp->wdata[i + offset]);
               }
               sp += n;
               /* check if more fragments will follow */
               if (aSDOp->Fragments > 0)
               {   
                  stop = FALSE;
               }
               First = FALSE; 
               offset = 0;
            }
            /* got unexpected response from slave */
            else
            {
               if ((aSDOp->Opcode &  0x7f) == ECT_SDOINFO_ERROR) /* SDO info error received */
               {
                  ecx_SDOinfoerror(context, Slave, 0, 0, etohl(aSDOp->ldata[0]));
                  stop = TRUE;
               }
               else
               {
                  ecx_packeterror(context, Slave, 0, 0, 1); /* Unexpected frame returned */
               }
               wkc = 0; 
               x += 20;
            }
         }
         x++;
      }
      while ((x <= 128) && !stop);
   }
   return wkc;
}